

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

LoopEvent rec_itern(jit_State *J,BCReg ra,BCReg rb)

{
  int iVar1;
  int iVar2;
  TRef local_d4;
  TRef local_d0;
  TValue TStack_c8;
  IRRef ref;
  RecordIndex ix;
  BCReg rb_local;
  BCReg ra_local;
  jit_State *J_local;
  
  ix.mobj = rb;
  ix.idxchain = ra;
  if (((((J->pc == J->startpc) && (J->framedepth + J->retdepth == 0)) && (J->parent == 0)) &&
      (J->exitno == 0)) &&
     ((0x8002 < (J->cur).nins ||
      (((J->cur).nins == 0x8002 && (*(char *)((long)(J->cur).ir + 0x4000d) != '\x15')))))) {
    J->instunroll = 0;
    lj_record_stop(J,LJ_TRLINK_LOOP,(uint)(J->cur).traceno);
    J_local._4_4_ = LOOPEV_ENTER;
  }
  else {
    J->maxslot = ra;
    lj_snap_add(J);
    if (J->base[ix.idxchain - 2] == 0) {
      local_d0 = sload(J,ix.idxchain + -2);
    }
    else {
      local_d0 = J->base[ix.idxchain - 2];
    }
    ix.oldv._0_4_ = local_d0;
    if (J->base[ix.idxchain - 1] == 0) {
      local_d4 = sloadt(J,ix.idxchain + -1,IRT_GUARD|IRT_INT,0x44);
    }
    else {
      local_d4 = J->base[ix.idxchain - 1];
    }
    iVar1 = ix.idxchain;
    ix.oldv._4_4_ = local_d4;
    TStack_c8 = J->L->base[ix.idxchain - 2];
    ix.tabv = J->L->base[ix.idxchain - 1];
    ix.mt = (TRef)(ix.mobj < 3);
    ix.val = 1;
    iVar2 = lj_record_next(J,(RecordIndex *)&stack0xffffffffffffff38);
    J->maxslot = iVar1 + iVar2;
    J->needsnap = '\x01';
    if ((ix.oldv._4_4_ & 0x1f000000) == 0) {
      J->maxslot = ix.idxchain - 3;
      J->pc = J->pc + 2;
      J_local._4_4_ = LOOPEV_LEAVE;
    }
    else {
      J->base[ix.idxchain - 1] = ix.val | 0x100000;
      J->base[(uint)ix.idxchain] = ix.oldv._4_4_;
      J->base[ix.idxchain + 1] = ix.tab;
      J->pc = J->pc + ((ulong)(J->pc[1] >> 0x10) - 0x7ffe);
      J_local._4_4_ = LOOPEV_ENTER;
    }
  }
  return J_local._4_4_;
}

Assistant:

static LoopEvent rec_itern(jit_State *J, BCReg ra, BCReg rb)
{
#if LJ_BE
  /* YAGNI: Disabled on big-endian due to issues with lj_vm_next,
  ** IR_HIOP, RID_RETLO/RID_RETHI and ra_destpair.
  */
  UNUSED(ra); UNUSED(rb);
  setintV(&J->errinfo, (int32_t)BC_ITERN);
  lj_trace_err_info(J, LJ_TRERR_NYIBC);
#else
  RecordIndex ix;
  /* Since ITERN is recorded at the start, we need our own loop detection. */
  if (J->pc == J->startpc &&
      J->framedepth + J->retdepth == 0 && J->parent == 0 && J->exitno == 0) {
    IRRef ref = REF_FIRST + LJ_HASPROFILE;
#ifdef LUAJIT_ENABLE_CHECKHOOK
    ref += 3;
#endif
    if (J->cur.nins > ref ||
       (LJ_HASPROFILE && J->cur.nins == ref && J->cur.ir[ref-1].o != IR_PROF)) {
      J->instunroll = 0;  /* Cannot continue unrolling across an ITERN. */
      lj_record_stop(J, LJ_TRLINK_LOOP, J->cur.traceno);  /* Looping trace. */
      return LOOPEV_ENTER;
    }
  }
  J->maxslot = ra;
  lj_snap_add(J);  /* Required to make JLOOP the first ins in a side-trace. */
  ix.tab = getslot(J, ra-2);
  ix.key = J->base[ra-1] ? J->base[ra-1] :
	   sloadt(J, (int32_t)(ra-1), IRT_GUARD|IRT_INT,
		  IRSLOAD_TYPECHECK|IRSLOAD_KEYINDEX);
  copyTV(J->L, &ix.tabv, &J->L->base[ra-2]);
  copyTV(J->L, &ix.keyv, &J->L->base[ra-1]);
  ix.idxchain = (rb < 3);  /* Omit value type check, if unused. */
  ix.mobj = 1;  /* We need the next index, too. */
  J->maxslot = ra + lj_record_next(J, &ix);
  J->needsnap = 1;
  if (!tref_isnil(ix.key)) {  /* Looping back? */
    J->base[ra-1] = ix.mobj | TREF_KEYINDEX;  /* Control var has next index. */
    J->base[ra] = ix.key;
    J->base[ra+1] = ix.val;
    J->pc += bc_j(J->pc[1])+2;
    return LOOPEV_ENTER;
  } else {
    J->maxslot = ra-3;
    J->pc += 2;
    return LOOPEV_LEAVE;
  }
#endif
}